

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

void length_update_prices(lzma_length_encoder *lc,uint32_t pos_state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = lc->table_size;
  lc->counters[pos_state] = uVar5;
  uVar7 = (ulong)(lc->choice >> 4);
  bVar1 = lzma_rc_prices[uVar7];
  bVar2 = lzma_rc_prices[uVar7 ^ 0x7f];
  uVar7 = (ulong)(lc->choice2 >> 4);
  bVar3 = lzma_rc_prices[uVar7];
  bVar4 = lzma_rc_prices[uVar7 ^ 0x7f];
  uVar7 = 8;
  if (uVar5 < 8) {
    uVar7 = (ulong)uVar5;
  }
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    uVar6 = rc_bittree_price(lc->low[pos_state],3,(uint32_t)uVar8);
    lc->prices[pos_state][uVar8] = uVar6 + bVar1;
  }
  uVar8 = 0x10;
  if (uVar5 < 0x10) {
    uVar8 = (ulong)uVar5;
  }
  for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    uVar6 = rc_bittree_price(lc->mid[pos_state],3,(int)uVar7 - 8);
    lc->prices[pos_state][uVar7] = uVar6 + (uint)bVar3 + (uint)bVar2;
  }
  for (; uVar7 < uVar5; uVar7 = uVar7 + 1) {
    uVar6 = rc_bittree_price(lc->high,8,(int)uVar7 - 0x10);
    lc->prices[pos_state][uVar7] = uVar6 + (uint)bVar4 + (uint)bVar2;
  }
  return;
}

Assistant:

static void
length_update_prices(lzma_length_encoder *lc, const uint32_t pos_state)
{
	uint32_t a0, a1, b0, b1;
	uint32_t *prices;
	uint32_t i;

	const uint32_t table_size = lc->table_size;
	lc->counters[pos_state] = table_size;

	a0 = rc_bit_0_price(lc->choice);
	a1 = rc_bit_1_price(lc->choice);
	b0 = a1 + rc_bit_0_price(lc->choice2);
	b1 = a1 + rc_bit_1_price(lc->choice2);
	prices = lc->prices[pos_state];

	for (i = 0; i < table_size && i < LEN_LOW_SYMBOLS; ++i)
		prices[i] = a0 + rc_bittree_price(lc->low[pos_state],
				LEN_LOW_BITS, i);

	for (; i < table_size && i < LEN_LOW_SYMBOLS + LEN_MID_SYMBOLS; ++i)
		prices[i] = b0 + rc_bittree_price(lc->mid[pos_state],
				LEN_MID_BITS, i - LEN_LOW_SYMBOLS);

	for (; i < table_size; ++i)
		prices[i] = b1 + rc_bittree_price(lc->high, LEN_HIGH_BITS,
				i - LEN_LOW_SYMBOLS - LEN_MID_SYMBOLS);

	return;
}